

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *vec,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *rhs)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  
  if ((this->l).updateType != 0) {
    solveUleft(this,vec,rhs);
    local_98.m_backend.fpclass = cpp_dec_float_finite;
    local_98.m_backend.prec_elem = 0x1c;
    local_98.m_backend.data._M_elems[0] = 0;
    local_98.m_backend.data._M_elems[1] = 0;
    local_98.m_backend.data._M_elems[2] = 0;
    local_98.m_backend.data._M_elems[3] = 0;
    local_98.m_backend.data._M_elems[4] = 0;
    local_98.m_backend.data._M_elems[5] = 0;
    local_98.m_backend.data._M_elems[6] = 0;
    local_98.m_backend.data._M_elems[7] = 0;
    local_98.m_backend.data._M_elems[8] = 0;
    local_98.m_backend.data._M_elems[9] = 0;
    local_98.m_backend.data._M_elems[10] = 0;
    local_98.m_backend.data._M_elems[0xb] = 0;
    local_98.m_backend.data._M_elems[0xc] = 0;
    local_98.m_backend.data._M_elems[0xd] = 0;
    local_98.m_backend.data._M_elems[0xe] = 0;
    local_98.m_backend.data._M_elems[0xf] = 0;
    local_98.m_backend.data._M_elems[0x10] = 0;
    local_98.m_backend.data._M_elems[0x11] = 0;
    local_98.m_backend.data._M_elems[0x12] = 0;
    local_98.m_backend.data._M_elems[0x13] = 0;
    local_98.m_backend.data._M_elems[0x14] = 0;
    local_98.m_backend.data._M_elems[0x15] = 0;
    local_98.m_backend.data._M_elems[0x16] = 0;
    local_98.m_backend.data._M_elems[0x17] = 0;
    local_98.m_backend.data._M_elems[0x18] = 0;
    local_98.m_backend.data._M_elems[0x19] = 0;
    local_98.m_backend.data._M_elems._104_5_ = 0;
    local_98.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_98.m_backend.exp = 0;
    local_98.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_98,0.0);
    solveLleftForest(this,vec,(int *)0x0,&local_98);
    solveLleft(this,vec);
    return;
  }
  solveUpdateLeft(this,rhs);
  solveUleft(this,vec,rhs);
  solveLleft(this,vec);
  return;
}

Assistant:

void CLUFactor<R>::solveLeft(R* vec, R* rhs)
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      solveUpdateLeft(rhs);
      solveUleft(vec, rhs);
      solveLleft(vec);
   }
   else
   {
      solveUleft(vec, rhs);
      //@todo is 0.0 the right value for eps here ?
      solveLleftForest(vec, nullptr, 0.0);
      solveLleft(vec);
   }
}